

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

result_type
time_plain<std::subtract_with_carry_engine<unsigned_long,24ul,10ul,24ul>>
          (subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL> *r)

{
  result_type rVar1;
  ulong uVar2;
  time_t *in_RSI;
  subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL> *in_RDI;
  string res;
  long i;
  long max;
  timer T;
  result_type s;
  double *in_stack_00000128;
  timer *in_stack_ffffffffffffff90;
  string local_50 [32];
  long local_30;
  long local_28;
  timer local_20;
  result_type local_10;
  subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL> *local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  timer::timer(in_stack_ffffffffffffff90);
  local_28 = 0x1000000;
  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
    rVar1 = std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>::operator()(local_8);
    local_10 = rVar1 + local_10;
  }
  timer::time(&local_20,in_RSI);
  to_string<double>(in_stack_00000128);
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (9 < uVar2) break;
    std::__cxx11::string::operator+=(local_50,' ');
  }
  std::operator<<((ostream *)&std::cout,local_50);
  rVar1 = local_10;
  std::__cxx11::string::~string(local_50);
  return rVar1;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}